

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool array_array_container_lazy_inplace_union
                (array_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  int iVar1;
  int iVar2;
  array_container_t *out;
  bitset_container_t *pbVar3;
  size_t sVar4;
  _Bool _Var5;
  int iVar6;
  bitset_container_t *ourbitset;
  
  iVar1 = src_1->cardinality;
  iVar2 = src_2->cardinality;
  iVar6 = iVar2 + iVar1;
  *dst = (container_t *)0x0;
  if (iVar6 < 0x401) {
    if (src_1->capacity < iVar6) {
      out = array_container_create_given_capacity(iVar6 * 2);
      *dst = out;
      if (out == (array_container_t *)0x0) {
        return true;
      }
      array_container_union(src_1,src_2,out);
    }
    else {
      memmove(src_1->array + iVar2,src_1->array,(long)iVar1 * 2);
      sVar4 = union_uint16(src_1->array + src_2->cardinality,(long)src_1->cardinality,src_2->array,
                           (long)src_2->cardinality,src_1->array);
      src_1->cardinality = (int32_t)sVar4;
    }
    _Var5 = false;
  }
  else {
    pbVar3 = bitset_container_create();
    *dst = pbVar3;
    _Var5 = true;
    if (pbVar3 != (bitset_container_t *)0x0) {
      bitset_set_list(pbVar3->words,src_1->array,(long)src_1->cardinality);
      bitset_set_list(pbVar3->words,src_2->array,(long)src_2->cardinality);
      pbVar3->cardinality = -1;
    }
  }
  return _Var5;
}

Assistant:

bool array_array_container_lazy_inplace_union(
    array_container_t *src_1, const array_container_t *src_2,
    container_t **dst
){
    int totalCardinality = src_1->cardinality + src_2->cardinality;
    *dst = NULL;
    if (totalCardinality <= ARRAY_LAZY_LOWERBOUND) {
        if(src_1->capacity < totalCardinality) {
          *dst = array_container_create_given_capacity(2  * totalCardinality); // be purposefully generous
          if (*dst != NULL) {
              array_container_union(src_1, src_2, CAST_array(*dst));
          } else {
            return true; // otherwise failure won't be caught
          }
          return false;  // not a bitset
        } else {
          memmove(src_1->array + src_2->cardinality, src_1->array, src_1->cardinality * sizeof(uint16_t));
          src_1->cardinality = (int32_t)union_uint16(src_1->array + src_2->cardinality, src_1->cardinality,
                                  src_2->array, src_2->cardinality, src_1->array);
          return false; // not a bitset
        }
    }
    *dst = bitset_container_create();
    bool returnval = true;  // expect a bitset
    if (*dst != NULL) {
        bitset_container_t *ourbitset = CAST_bitset(*dst);
        bitset_set_list(ourbitset->words, src_1->array, src_1->cardinality);
        bitset_set_list(ourbitset->words, src_2->array, src_2->cardinality);
        ourbitset->cardinality = BITSET_UNKNOWN_CARDINALITY;
    }
    return returnval;
}